

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void test_qclab_dense_memory<float>(void)

{
  bool bVar1;
  type pfVar2;
  char *pcVar3;
  float fVar4;
  AssertHelper local_258;
  Message local_250;
  float local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_11;
  int64_t i_2;
  unique_ptr<float[],_std::default_delete<float[]>_> init10;
  Message local_218;
  float local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_10;
  Message local_1f0;
  float local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_9;
  unique_ptr<float[],_std::default_delete<float[]>_> init2;
  Message local_1c0;
  float local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_8;
  unique_ptr<float[],_std::default_delete<float[]>_> init1;
  Message local_190;
  float local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_7;
  int64_t i_1;
  unique_ptr<float[],_std::default_delete<float[]>_> mem10;
  Message local_158;
  float local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_6;
  Message local_130;
  float local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_5;
  unique_ptr<float[],_std::default_delete<float[]>_> mem2;
  Message local_100;
  float local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  unique_ptr<float[],_std::default_delete<float[]>_> mem1;
  Message local_d0;
  float local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  int64_t i;
  unique_ptr<float[],_std::default_delete<float[]>_> alloc10;
  Message local_98;
  float local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  float local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  unique_ptr<float[],_std::default_delete<float[]>_> alloc2;
  Message local_40;
  float local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  unique_ptr<float[],_std::default_delete<float[]>_> local_10;
  unique_ptr<float[],_std::default_delete<float[]>_> alloc1;
  
  qclab::dense::alloc_unique_array<float>((dense *)&local_10,1);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&local_10,0);
  *pfVar2 = 5.0;
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&local_10,0);
  local_34 = 5.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_30,"alloc1[0]","T(5)",pfVar2,&local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&alloc2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0xb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&alloc2,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&alloc2);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  qclab::dense::alloc_unique_array<float>((dense *)&gtest_ar_1.message_,2);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_1.message_,0);
  *pfVar2 = 5.0;
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_1.message_,1);
  *pfVar2 = 6.0;
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_1.message_,0);
  local_64 = 5.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_60,"alloc2[0]","T(5)",pfVar2,&local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x10,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_1.message_,1);
  local_8c = 6.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_88,"alloc2[1]","T(6)",pfVar2,&local_8c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&alloc10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&alloc10,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&alloc10);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  qclab::dense::alloc_unique_array<float>((dense *)&i,10);
  for (gtest_ar_3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    fVar4 = (float)(long)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i,
                        (size_t)gtest_ar_3.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    *pfVar2 = fVar4;
    pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i,
                        (size_t)gtest_ar_3.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    local_c4 = (float)(long)gtest_ar_3.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((EqHelper *)local_c0,"alloc10[i]","T(i)",pfVar2,&local_c4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mem1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x16,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&mem1,&local_d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem1);
      testing::Message::~Message(&local_d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  }
  qclab::dense::init_unique_array<float>((dense *)&gtest_ar_4.message_,1);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_4.message_,0);
  local_f4 = 0.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_f0,"mem1[0]","T(0)",pfVar2,&local_f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mem2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mem2,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem2);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  qclab::dense::init_unique_array<float>((dense *)&gtest_ar_5.message_,2);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_5.message_,0);
  local_124 = 0.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_120,"mem2[0]","T(0)",pfVar2,&local_124);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_5.message_,1);
  local_14c = 0.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_148,"mem2[1]","T(0)",pfVar2,&local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mem10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mem10,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem10);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  qclab::dense::init_unique_array<float>((dense *)&i_1,10);
  for (gtest_ar_7.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_7.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_7.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_1,
                        (size_t)gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    local_184 = 0.0;
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((EqHelper *)local_180,"mem10[i]","T(0)",pfVar2,&local_184);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&init1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x23,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&init1,&local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init1);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  }
  qclab::dense::init_unique_array<float>((dense *)&gtest_ar_8.message_,1,3.14);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_8.message_,0);
  local_1b4 = 3.14;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_1b0,"init1[0]","T(3.14)",pfVar2,&local_1b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&init2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x28,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&init2,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init2);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  qclab::dense::init_unique_array<float>((dense *)&gtest_ar_9.message_,2,3.14);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_9.message_,0);
  local_1e4 = 3.14;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_1e0,"init2[0]","T(3.14)",pfVar2,&local_1e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_9.message_,1);
  local_20c = 3.14;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_208,"init2[1]","T(3.14)",pfVar2,&local_20c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&init10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x2c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&init10,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init10);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  qclab::dense::init_unique_array<float>((dense *)&i_2,10,3.14);
  for (gtest_ar_11.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_11.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_11.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_2,
                        (size_t)gtest_ar_11.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    local_244 = 3.14;
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((EqHelper *)local_240,"init10[i]","T(3.14)",pfVar2,&local_244);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x30,pcVar3);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  }
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_2);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_9.message_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_8.message_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_1);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_5.message_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_4.message_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar_1.message_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_10);
  return;
}

Assistant:

void test_qclab_dense_memory() {

  // alloc_unique_array
  std::unique_ptr< T[] >  alloc1 = qclab::dense::alloc_unique_array< T >( 1 ) ;
  alloc1[0] = T(5) ;
  EXPECT_EQ( alloc1[0] , T(5) ) ;

  std::unique_ptr< T[] >  alloc2 = qclab::dense::alloc_unique_array< T >( 2 ) ;
  alloc2[0] = T(5) ;
  alloc2[1] = T(6) ;
  EXPECT_EQ( alloc2[0] , T(5) ) ;
  EXPECT_EQ( alloc2[1] , T(6) ) ;

  std::unique_ptr< T[] >  alloc10 = qclab::dense::alloc_unique_array< T >( 10 );
  for ( int64_t i = 0; i < 1; i++ ) {
    alloc10[i] = T(i) ;
    EXPECT_EQ( alloc10[i] , T(i) ) ;
  }

  // init_unique_array (zero)
  std::unique_ptr< T[] >  mem1 = qclab::dense::init_unique_array< T >( 1 ) ;
  EXPECT_EQ( mem1[0] , T(0) ) ;

  std::unique_ptr< T[] >  mem2 = qclab::dense::init_unique_array< T >( 2 ) ;
  EXPECT_EQ( mem2[0] , T(0) ) ;
  EXPECT_EQ( mem2[1] , T(0) ) ;

  std::unique_ptr< T[] >  mem10 = qclab::dense::init_unique_array< T >( 10 ) ;
  for ( int64_t i = 0; i < 1; i++ ) {
    EXPECT_EQ( mem10[i] , T(0) ) ;
  }

  // init_unique_array (zero)
  auto init1 = qclab::dense::init_unique_array< T >( 1 , T(3.14) ) ;
  EXPECT_EQ( init1[0] , T(3.14) ) ;

  auto init2 = qclab::dense::init_unique_array< T >( 2 , T(3.14) ) ;
  EXPECT_EQ( init2[0] , T(3.14) ) ;
  EXPECT_EQ( init2[1] , T(3.14) ) ;

  auto init10 = qclab::dense::init_unique_array< T >( 10 , T(3.14) ) ;
  for ( int64_t i = 0; i < 1; i++ ) {
    EXPECT_EQ( init10[i] , T(3.14) ) ;
  }

}